

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O2

void Min_CoverExpand(Min_Man_t *p,Min_Cube_t *pCover)

{
  Min_Cube_t **ppMVar1;
  Min_Cube_t *pMVar2;
  Min_Cube_t *pMVar3;
  uint uVar4;
  
  Min_ManClean(p,p->nVars);
  if (pCover == (Min_Cube_t *)0x0) {
    pMVar2 = (Min_Cube_t *)0x0;
  }
  else {
    pMVar2 = pCover->pNext;
  }
  while (pMVar3 = pMVar2, pCover != (Min_Cube_t *)0x0) {
    ppMVar1 = p->ppStore;
    uVar4 = *(uint *)&pCover->field_0x8 >> 0x16;
    pCover->pNext = ppMVar1[uVar4];
    ppMVar1[uVar4] = pCover;
    p->nCubes = p->nCubes + 1;
    pMVar2 = (Min_Cube_t *)0x0;
    pCover = pMVar3;
    if (pMVar3 != (Min_Cube_t *)0x0) {
      pMVar2 = pMVar3->pNext;
    }
  }
  return;
}

Assistant:

void Min_CoverExpand( Min_Man_t * p, Min_Cube_t * pCover )
{
    Min_Cube_t * pCube, * pCube2;
    Min_ManClean( p, p->nVars );
    Min_CoverForEachCubeSafe( pCover, pCube, pCube2 )
    {
        pCube->pNext = p->ppStore[pCube->nLits];
        p->ppStore[pCube->nLits] = pCube;
        p->nCubes++;
    }
}